

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O0

void __thiscall
glu::FboRenderContext::FboRenderContext
          (FboRenderContext *this,ContextFactory *factory,RenderConfig *config,CommandLine *cmdLine)

{
  int iVar1;
  undefined4 extraout_var;
  ContextType local_70;
  undefined1 local_6c [8];
  RenderConfig nativeRenderConfig;
  CommandLine *cmdLine_local;
  RenderConfig *config_local;
  ContextFactory *factory_local;
  FboRenderContext *this_local;
  
  RenderContext::RenderContext(&this->super_RenderContext);
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__FboRenderContext_016cefe8;
  this->m_context = (RenderContext *)0x0;
  this->m_framebuffer = 0;
  this->m_colorBuffer = 0;
  this->m_depthStencilBuffer = 0;
  tcu::RenderTarget::RenderTarget(&this->m_renderTarget);
  ContextType::ContextType(&local_70);
  RenderConfig::RenderConfig((RenderConfig *)local_6c,local_70);
  local_6c._0_4_ = (config->type).super_ApiType.m_bits;
  nativeRenderConfig.height = config->windowVisibility;
  iVar1 = (*(factory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])
                    (factory,local_6c,cmdLine);
  this->m_context = (RenderContext *)CONCAT44(extraout_var,iVar1);
  createFramebuffer(this,config);
  return;
}

Assistant:

FboRenderContext::FboRenderContext (const ContextFactory& factory, const RenderConfig& config, const tcu::CommandLine& cmdLine)
	: m_context				(DE_NULL)
	, m_framebuffer			(0)
	, m_colorBuffer			(0)
	, m_depthStencilBuffer	(0)
	, m_renderTarget		()
{
	try
	{
		RenderConfig nativeRenderConfig;
		nativeRenderConfig.type				= config.type;
		nativeRenderConfig.windowVisibility	= config.windowVisibility;
		// \note All other properties are defaults, mostly DONT_CARE
		m_context = factory.createContext(nativeRenderConfig, cmdLine);
		createFramebuffer(config);
	}
	catch (...)
	{
		delete m_context;
		throw;
	}
}